

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int helicsDataBufferVectorSize(HelicsDataBuffer data)

{
  DataType DVar1;
  byte *data_00;
  size_t sVar2;
  size_type sVar3;
  vector<double,_std::allocator<double>_> v;
  SmallBuffer *ptr;
  vector<double,_std::allocator<double>_> *in_stack_00000120;
  DataType in_stack_0000012c;
  data_view *in_stack_00000130;
  HelicsDataBuffer in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa4;
  SmallBuffer *in_stack_ffffffffffffffa8;
  data_view *in_stack_ffffffffffffffb0;
  vector<double,_std::allocator<double>_> local_30;
  SmallBuffer *local_18;
  int local_4;
  
  local_18 = getBuffer(in_stack_ffffffffffffff98);
  if (local_18 == (SmallBuffer *)0x0) {
    return 0;
  }
  helics::SmallBuffer::data(local_18);
  DVar1 = helics::detail::detectType((byte *)in_stack_ffffffffffffffa8);
  if (1 < (uint)(DVar1 + HELICS_UNKNOWN)) {
    if (DVar1 == HELICS_COMPLEX) {
      return 2;
    }
    if ((uint)(DVar1 + ~HELICS_COMPLEX) < 2) {
      data_00 = helics::SmallBuffer::data(local_18);
      sVar2 = helics::detail::getDataSize(data_00);
      return (int)sVar2;
    }
    if (DVar1 != HELICS_BOOL) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x1f4a23);
      helics::data_view::data_view(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      helics::SmallBuffer::data(local_18);
      helics::detail::detectType((byte *)in_stack_ffffffffffffffa8);
      helics::valueExtract(in_stack_00000130,in_stack_0000012c,in_stack_00000120);
      helics::data_view::~data_view((data_view *)0x1f4a72);
      sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_30);
      local_4 = (int)sVar3;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffffa4,DVar1));
      return local_4;
    }
  }
  return 1;
}

Assistant:

int helicsDataBufferVectorSize(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    switch (helics::detail::detectType(ptr->data())) {
        case helics::DataType::HELICS_VECTOR:
        case helics::DataType::HELICS_COMPLEX_VECTOR:
            return static_cast<int>(helics::detail::getDataSize(ptr->data()));
        case helics::DataType::HELICS_BOOL:
        case helics::DataType::HELICS_INT:
        case helics::DataType::HELICS_DOUBLE:
            return 1;
        case helics::DataType::HELICS_COMPLEX:
            return 2;
        default: {
            std::vector<double> v;
            helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);
            return static_cast<int>(v.size());
        } break;
    }
}